

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int memory_write(mtar_t *tar,void *data,size_t size)

{
  void *__ptr;
  int iVar1;
  size_t __size;
  ulong uVar2;
  
  iVar1 = -4;
  if (tar->stream == (void *)0x0) {
    if (size != 0) {
      uVar2 = tar->memory_pos + size;
      __ptr = tar->memory;
      if (tar->memory_capacity < uVar2) {
        __size = 0x400;
        if (0x400 < uVar2) {
          __size = uVar2 * 2;
        }
        __ptr = realloc(__ptr,__size);
        if (__ptr == (void *)0x0) {
          return -4;
        }
        tar->memory = __ptr;
        tar->memory_size = uVar2;
        tar->memory_capacity = __size;
      }
      else if (tar->memory_size < uVar2) {
        tar->memory_size = uVar2;
      }
      else if (__ptr == (void *)0x0) {
        return -4;
      }
      memcpy((void *)((long)__ptr + tar->memory_pos),data,size);
      tar->memory_pos = tar->memory_pos + size;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int memory_write(mtar_t *tar, const void *data, size_t size) {
  char *memory;
  size_t request_size, new_capacity;

  if (tar->stream)
    return MTAR_EWRITEFAIL;

  if (!size)
    return MTAR_ESUCCESS;

  request_size = tar->memory_pos + size;
  if (request_size > tar->memory_capacity) {
    if (request_size <= 1024)
      new_capacity = 1024;
    else
      new_capacity = request_size * 2;
    memory = (char *)realloc(tar->memory, new_capacity);
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
    tar->memory = memory;
    tar->memory_size = request_size;
    tar->memory_capacity = new_capacity;
  } else if (request_size > tar->memory_size) {
    memory = (char *)tar->memory;
    tar->memory_size = request_size;
  } else {
    memory = (char *)tar->memory;
    if (!memory) {
      return MTAR_EWRITEFAIL;
    }
  }

  memcpy(&memory[tar->memory_pos], data, size);
  tar->memory_pos += size;

  return MTAR_ESUCCESS;
}